

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O1

int SUNClassicalGS(N_Vector *v,realtype **h,int k,int p,realtype *new_vk_norm,realtype *stemp,
                  N_Vector *vtemp)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  realtype rVar6;
  double dVar7;
  realtype rVar8;
  double dVar9;
  
  uVar1 = k - p;
  if (k < p) {
    p = k;
  }
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  iVar2 = N_VDotProdMulti(p + 1U,v[k],v + uVar5,stemp);
  if (iVar2 != 0) {
    return -1;
  }
  dVar7 = stemp[p];
  dVar9 = 0.0;
  if (0.0 < dVar7) {
    if (dVar7 < 0.0) {
      dVar9 = sqrt(dVar7);
    }
    else {
      dVar9 = SQRT(dVar7);
    }
  }
  iVar2 = k + -1;
  if (0 < p) {
    lVar4 = (ulong)(uint)p + 1;
    do {
      h[lVar4 + -2][iVar2] = stemp[lVar4 + -2];
      stemp[lVar4 + -1] = -stemp[lVar4 + -2];
      vtemp[lVar4 + -1] = v[lVar4 + -2];
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  *stemp = 1.0;
  *vtemp = v[k];
  iVar3 = N_VLinearCombination(p + 1U,stemp,vtemp,v[k]);
  if (iVar3 == 0) {
    rVar6 = N_VDotProd(v[k],v[k]);
    dVar7 = 0.0;
    if (0.0 < rVar6) {
      rVar6 = N_VDotProd(v[k],v[k]);
      if (rVar6 < 0.0) {
        dVar7 = sqrt(rVar6);
      }
      else {
        dVar7 = SQRT(rVar6);
      }
    }
    *new_vk_norm = dVar7;
    if (dVar7 * 1000.0 < dVar9) {
      iVar3 = N_VDotProdMulti(p,v[k],v + uVar5,stemp + 1);
      if (iVar3 != 0) goto LAB_0050d98b;
      *stemp = 1.0;
      *vtemp = v[k];
      if ((int)uVar5 < k) {
        lVar4 = 0;
        do {
          h[uVar5 + lVar4][iVar2] = stemp[lVar4 + 1] + h[uVar5 + lVar4][iVar2];
          stemp[lVar4 + 1] = -stemp[lVar4 + 1];
          vtemp[lVar4 + 1] = v[lVar4];
          lVar4 = lVar4 + 1;
        } while ((uint)k - uVar5 != lVar4);
      }
      iVar2 = N_VLinearCombination(k + 1,stemp,vtemp,v[k]);
      if (iVar2 != 0) {
        return -1;
      }
      rVar6 = N_VDotProd(v[k],v[k]);
      rVar8 = 0.0;
      if (0.0 < rVar6) {
        rVar8 = N_VDotProd(v[k],v[k]);
        if (rVar8 < 0.0) {
          rVar8 = sqrt(rVar8);
        }
        else {
          rVar8 = SQRT(rVar8);
        }
      }
      *new_vk_norm = rVar8;
    }
    iVar2 = 0;
  }
  else {
LAB_0050d98b:
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int SUNClassicalGS(N_Vector *v, realtype **h, int k, int p, realtype *new_vk_norm,
                   realtype *stemp, N_Vector *vtemp)
{
  int  i, i0, k_minus_1, retval;
  realtype vk_norm;

  k_minus_1 = k - 1;
  i0 = SUNMAX(k-p,0);

  /* Perform Classical Gram-Schmidt */

  retval = N_VDotProdMulti(k-i0+1, v[k], v+i0, stemp);
  if (retval != 0) return(-1);

  vk_norm = SUNRsqrt(stemp[k-i0]);
  for (i=k-i0-1; i >= 0; i--) {
    h[i][k_minus_1] = stemp[i];
    stemp[i+1] = -stemp[i];
    vtemp[i+1] = v[i];
  }
  stemp[0] = ONE;
  vtemp[0] = v[k];

  retval = N_VLinearCombination(k-i0+1, stemp, vtemp, v[k]);
  if (retval != 0) return(-1);

  /* Compute the norm of the new vector at v[k] */

  *new_vk_norm = SUNRsqrt(N_VDotProd(v[k], v[k]));

  /* Reorthogonalize if necessary */

  if ((FACTOR * (*new_vk_norm)) < vk_norm) {

    retval = N_VDotProdMulti(k-i0, v[k], v+i0, stemp+1);
    if (retval != 0) return(-1);

    stemp[0] = ONE;
    vtemp[0] = v[k];
    for (i=i0; i < k; i++) {
      h[i][k_minus_1] += stemp[i-i0+1];
      stemp[i-i0+1] = -stemp[i-i0+1];
      vtemp[i-i0+1] = v[i-i0];
    }

    retval = N_VLinearCombination(k+1, stemp, vtemp, v[k]);
    if (retval != 0) return(-1);

    *new_vk_norm = SUNRsqrt(N_VDotProd(v[k],v[k]));
  }

  return(0);
}